

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refdbm.cc
# Opt level: O2

status_t tchecker::refdbm::bound_spread(db_t *rdbm,reference_clock_variables_t *r,integer_t spread)

{
  status_t sVar1;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> ref_clocks;
  allocator<unsigned_long> local_41;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_40;
  
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&local_40,(ulong)r->_refcount,0,&local_41);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set(&local_40);
  sVar1 = bound_spread(rdbm,r,spread,&local_40);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset(&local_40);
  return sVar1;
}

Assistant:

enum tchecker::dbm::status_t bound_spread(tchecker::dbm::db_t * rdbm, tchecker::reference_clock_variables_t const & r,
                                          tchecker::integer_t spread)
{
  boost::dynamic_bitset<> ref_clocks{r.refcount()};
  ref_clocks.set();
  return tchecker::refdbm::bound_spread(rdbm, r, spread, ref_clocks);
}